

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_address_set_hostname(ENetAddress *address,char *name)

{
  sockaddr *psVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  addrinfo *paVar5;
  sockaddr_in *sin;
  addrinfo *resultList;
  addrinfo *local_50;
  addrinfo local_48;
  
  local_50 = (addrinfo *)0x0;
  local_48.ai_flags = 0;
  local_48.ai_family = 0;
  local_48.ai_socktype = 0;
  local_48.ai_protocol = 0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  iVar3 = getaddrinfo(name,(char *)0x0,&local_48,&local_50);
  iVar4 = -1;
  paVar5 = local_50;
  if (iVar3 == 0) {
    for (; paVar5 != (addrinfo *)0x0; paVar5 = paVar5->ai_next) {
      psVar1 = paVar5->ai_addr;
      if ((psVar1 != (sockaddr *)0x0) && (0xf < paVar5->ai_addrlen)) {
        if (paVar5->ai_family == 10) {
          uVar2 = *(undefined8 *)(psVar1 + 1);
          *(undefined8 *)&address->field_0 = *(undefined8 *)(psVar1->sa_data + 6);
          *(undefined8 *)((long)&address->field_0 + 8) = uVar2;
LAB_00107776:
          freeaddrinfo(local_50);
          return 0;
        }
        if (paVar5->ai_family == 2) {
          *(undefined8 *)&address->field_0 = 0;
          *(undefined4 *)((long)&address->field_0 + 8) = 0xffff0000;
          (address->field_0).ipv4.ip.s_addr = *(in_addr_t *)(psVar1->sa_data + 2);
          goto LAB_00107776;
        }
      }
    }
    if (local_50 != (addrinfo *)0x0) {
      freeaddrinfo(local_50);
    }
    iVar4 = enet_address_set_ip(address,name);
  }
  return iVar4;
}

Assistant:

int enet_address_set_hostname(ENetAddress* address, const char* name) {
	struct addrinfo hints, * resultList = NULL, * result = NULL;

	memset(&hints, 0, sizeof(hints));

	hints.ai_family = AF_UNSPEC;

	if (getaddrinfo(name, NULL, &hints, &resultList) != 0) {
		ENET_LOG_ERROR("Getaddrinfo() returned an error");
		return -1;
	}

	for (result = resultList; result != NULL; result = result->ai_next) {
		if (result->ai_addr != NULL && result->ai_addrlen >= sizeof(struct sockaddr_in)) {
			if (result->ai_family == AF_INET) {
				struct sockaddr_in* sin = (struct sockaddr_in*)result->ai_addr;

				memset(address, 0, sizeof(address->ipv4.zeros));

				address->ipv4.ffff = 0xFFFF;
				address->ipv4.ip.s_addr = sin->sin_addr.s_addr;

				freeaddrinfo(resultList);

				return 0;
			}
			else if (result->ai_family == AF_INET6) {
				struct sockaddr_in6* sin = (struct sockaddr_in6*)result->ai_addr;

				address->ipv6 = sin->sin6_addr;

				freeaddrinfo(resultList);

				return 0;
			}
		}
	}

	if (resultList != NULL)
		freeaddrinfo(resultList);

	return enet_address_set_ip(address, name);
}